

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  Output::Print(L" R%d ",(ulong)data->R0);
  Output::Print(L" R%d ",(ulong)data->R1);
  Output::Print(L" R%d ",(ulong)data->R2);
  Output::Print(L" R%d ",(ulong)data->R3);
  Output::Print(L" R%d ",(ulong)data->R4);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg5(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpReg(data->R3);
        DumpReg(data->R4);
    }